

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall QMessageBox::setStandardButtons(QMessageBox *this,StandardButtons buttons)

{
  long lVar1;
  QMessageBoxPrivate *this_00;
  long lVar2;
  long in_RCX;
  long lVar3;
  long in_FS_OFFSET;
  QList<QAbstractButton_*> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QDialogButtonBox::setStandardButtons
            ((QDialogButtonBox *)this_00->buttonBox,
             (StandardButtons)
             buttons.super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>.
             super_QFlagsStorage<QMessageBox::StandardButton>.i);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  QDialogButtonBox::buttons(&local_38,(QDialogButtonBox *)this_00->buttonBox);
  if ((undefined1 *)local_38.d.size == (undefined1 *)0x0) {
LAB_0050bdcf:
    in_RCX = -1;
  }
  else {
    lVar3 = -8;
    do {
      lVar1 = local_38.d.size * -8 + lVar3;
      if (lVar1 == -8) goto LAB_0050bdc9;
      in_RCX = lVar3 + 8;
      lVar2 = lVar3 + 8;
      lVar3 = in_RCX;
    } while (*(QAbstractButton **)((long)local_38.d.ptr + lVar2) != this_00->escapeButton);
    in_RCX = in_RCX >> 3;
LAB_0050bdc9:
    if (lVar1 == -8) goto LAB_0050bdcf;
  }
  if (in_RCX == -1) {
    this_00->escapeButton = (QAbstractButton *)0x0;
  }
  if ((undefined1 *)local_38.d.size != (undefined1 *)0x0) {
    lVar3 = -8;
    do {
      lVar1 = local_38.d.size * -8 + lVar3;
      if (lVar1 == -8) goto LAB_0050be22;
      in_RCX = lVar3 + 8;
      lVar2 = lVar3 + 8;
      lVar3 = in_RCX;
    } while (*(QPushButton **)((long)local_38.d.ptr + lVar2) != this_00->defaultButton);
    in_RCX = in_RCX >> 3;
LAB_0050be22:
    if (lVar1 != -8) goto LAB_0050be2f;
  }
  in_RCX = -1;
LAB_0050be2f:
  if (in_RCX == -1) {
    this_00->defaultButton = (QPushButton *)0x0;
  }
  this_00->autoAddOkButton = false;
  QMessageBoxPrivate::updateSize(this_00);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setStandardButtons(StandardButtons buttons)
{
    Q_D(QMessageBox);
    d->buttonBox->setStandardButtons(QDialogButtonBox::StandardButtons(int(buttons)));

    QList<QAbstractButton *> buttonList = d->buttonBox->buttons();
    if (!buttonList.contains(d->escapeButton))
        d->escapeButton = nullptr;
    if (!buttonList.contains(d->defaultButton))
        d->defaultButton = nullptr;
    d->autoAddOkButton = false;
    d->updateSize();
}